

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ushort uVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterYs<unsigned_short> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  ImPlotContext *pIVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pIVar19 = GImPlot;
  pGVar9 = this->Getter;
  pTVar10 = this->Transformer;
  iVar20 = pGVar9->Count;
  uVar6 = *(ushort *)
           ((long)pGVar9->Ys +
           (long)(((prim + 1 + pGVar9->Offset) % iVar20 + iVar20) % iVar20) * (long)pGVar9->Stride);
  dVar15 = log10(((double)(prim + 1) * pGVar9->XScale + pGVar9->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar19->CurrentPlot;
  dVar1 = pIVar19->LogDenX;
  dVar2 = (pIVar11->XAxis).Range.Min;
  dVar3 = (pIVar11->XAxis).Range.Max;
  dVar16 = log10((double)uVar6 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar20 = pTVar10->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  auVar25._8_8_ = dVar16;
  auVar25._0_8_ = dVar15;
  auVar26._8_4_ = SUB84(pIVar19->LogDenY[iVar20],0);
  auVar26._0_8_ = dVar1;
  auVar26._12_4_ = (int)((ulong)pIVar19->LogDenY[iVar20] >> 0x20);
  auVar26 = divpd(auVar25,auVar26);
  dVar1 = pIVar11->YAxis[iVar20].Range.Min;
  IVar4 = pIVar19->PixelRange[iVar20].Min;
  fVar21 = (float)(pIVar19->Mx *
                   (((double)(float)auVar26._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  fVar22 = (float)(pIVar19->My[iVar20] *
                   (((double)(float)auVar26._8_8_ * (pIVar11->YAxis[iVar20].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar23 = (this->P1).x;
  fVar24 = (this->P1).y;
  auVar30._0_4_ = ~-(uint)(fVar21 <= fVar23) & (uint)fVar21;
  auVar30._4_4_ = ~-(uint)(fVar22 <= fVar24) & (uint)fVar22;
  auVar30._8_4_ = ~-(uint)(fVar23 < fVar21) & (uint)fVar21;
  auVar30._12_4_ = ~-(uint)(fVar24 < fVar22) & (uint)fVar22;
  auVar17._4_4_ = (uint)fVar24 & -(uint)(fVar22 <= fVar24);
  auVar17._0_4_ = (uint)fVar23 & -(uint)(fVar21 <= fVar23);
  auVar17._8_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar21);
  auVar17._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar22);
  auVar30 = auVar30 | auVar17;
  fVar27 = (cull_rect->Min).y;
  auVar18._4_8_ = auVar30._8_8_;
  auVar18._0_4_ = -(uint)(auVar30._4_4_ < fVar27);
  auVar31._0_8_ = auVar18._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(auVar30._8_4_ < (cull_rect->Max).x);
  auVar31._12_4_ = -(uint)(auVar30._12_4_ < (cull_rect->Max).y);
  auVar32._4_4_ = -(uint)(fVar27 < auVar30._4_4_);
  auVar32._0_4_ = -(uint)((cull_rect->Min).x < auVar30._0_4_);
  auVar32._8_8_ = auVar31._8_8_;
  iVar20 = movmskps((int)pIVar11,auVar32);
  if (iVar20 == 0xf) {
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar27 = fVar21 - fVar23;
    fVar28 = fVar22 - fVar24;
    fVar29 = fVar27 * fVar27 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar27 = fVar27 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->uv = IVar4;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar7;
    fVar27 = fVar29 * fVar27;
    fVar29 = fVar29 * fVar28;
    (pIVar12->pos).x = fVar23 + fVar29;
    (pIVar12->pos).y = fVar24 - fVar27;
    pIVar13[1].pos.x = fVar29 + fVar21;
    pIVar13[1].pos.y = fVar22 - fVar27;
    pIVar13[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar21 - fVar29;
    pIVar12[2].pos.y = fVar27 + fVar22;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    IVar5 = this->P1;
    pIVar12[3].pos.x = IVar5.x - fVar29;
    pIVar12[3].pos.y = IVar5.y + fVar27;
    pIVar12[3].uv.x = IVar4.x;
    pIVar12[3].uv.y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    puVar14 = DrawList->_IdxWritePtr;
    *puVar14 = uVar8;
    puVar14[1] = uVar8 + 1;
    puVar14[2] = DrawList->_VtxCurrentIdx + 2;
    uVar8 = DrawList->_VtxCurrentIdx;
    puVar14[3] = uVar8;
    puVar14[4] = uVar8 + 2;
    puVar14[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar14 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar4.y = fVar22;
  IVar4.x = fVar21;
  this->P1 = IVar4;
  return (char)iVar20 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }